

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2_variable_reference.cpp
# Opt level: O3

string * mod_string_by_creating_temp(string *__return_storage_ptr__,string *s1,string *s2)

{
  long *plVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long *local_38;
  long local_30;
  long local_28;
  long lStack_20;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_58,s2,s1);
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)(s2->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_28 = *plVar2;
    lStack_20 = plVar1[3];
    local_38 = &local_28;
  }
  else {
    local_28 = *plVar2;
    local_38 = (long *)*plVar1;
  }
  local_30 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string mod_string_by_creating_temp(const std::string & s1, const std::string & s2) {
    std::string temp;
    temp = s2 + s1 + s2;
    //  返回一份 string 的复制
    return temp;
}